

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O0

int dill_scalld(dill_stream_conflict s,void *ptr,char *name,char *arg_str,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  int ret_reg;
  __va_list_tag *in_stack_00000800;
  char *in_stack_00000808;
  dill_stream_conflict in_stack_00000810;
  undefined1 auStack_f8 [32];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  long *local_8;
  
  local_38 = auStack_f8;
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_40 = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x20;
  local_d8 = in_R8;
  local_d0 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do_vararg_push(in_stack_00000810,in_stack_00000808,in_stack_00000800);
  iVar1 = (**(code **)(*local_8 + 0x140))(local_8,10,local_10,local_18);
  return iVar1;
}

Assistant:

int
dill_scalld(dill_stream s,
            void* ptr,
            const char* name,
            const char* arg_str,
            ...)
{
    int ret_reg;
    va_list ap;
    va_start(ap, arg_str);
    do_vararg_push(s, arg_str, ap);
    ret_reg = s->j->calli(s, DILL_D, ptr, name);
    va_end(ap);
    return ret_reg;
}